

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateCaseBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain,
          uint32_t element_index,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned,uint32_t branch_target_id,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  BasicBlock *case_block;
  
  case_block = CreateNewBlock(this);
  AddConstElementAccessToCaseBlock(this,case_block,access_chain,element_index,old_ids_to_new_ids);
  CloneInstsToBlock(this,case_block,access_chain,insts_to_be_cloned,old_ids_to_new_ids);
  AddBranchToBlock(this,case_block,branch_target_id);
  UseNewIdsInBlock(this,case_block,old_ids_to_new_ids);
  return case_block;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateCaseBlock(
    Instruction* access_chain, uint32_t element_index,
    const std::deque<Instruction*>& insts_to_be_cloned,
    uint32_t branch_target_id,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  auto* case_block = CreateNewBlock();
  AddConstElementAccessToCaseBlock(case_block, access_chain, element_index,
                                   old_ids_to_new_ids);
  CloneInstsToBlock(case_block, access_chain, insts_to_be_cloned,
                    old_ids_to_new_ids);
  AddBranchToBlock(case_block, branch_target_id);
  UseNewIdsInBlock(case_block, *old_ids_to_new_ids);
  return case_block;
}